

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_get_populated_multiple(planck_unit_test_t *tc)

{
  int iVar1;
  int iVar2;
  int local_a0;
  int local_9c;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  bhdct_setup(tc,&handler,&dict,ion_fill_low);
  iVar1 = 0;
  for (iVar2 = 0; iVar2 != 10; iVar2 = iVar2 + 1) {
    local_a0 = iVar1;
    local_9c = iVar2;
    bhdct_get(tc,&dict,&local_9c,&local_a0,'\0',1);
    iVar1 = iVar1 + 2;
  }
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_get_populated_multiple(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_low);

	int i;

	ION_FILL_LOW_LOOP(i) {
		bhdct_get(tc, &dict, IONIZE(i, int), ION_LOW_VALUE(i), err_ok, 1);
	}

	bhdct_takedown(tc, &dict);
}